

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  bool bVar1;
  logic_error *this_00;
  string local_40;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    adjustCase(&local_40,this,str);
    bVar1 = std::operator==(&this->m_pattern,&local_40);
    break;
  case WildcardAtStart:
    adjustCase(&local_40,this,str);
    bVar1 = endsWith(&local_40,&this->m_pattern);
    break;
  case WildcardAtEnd:
    adjustCase(&local_40,this,str);
    bVar1 = startsWith(&local_40,&this->m_pattern);
    break;
  case WildcardAtBothEnds:
    adjustCase(&local_40,this,str);
    bVar1 = contains(&local_40,&this->m_pattern);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown enum");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

virtual bool matches(std::string const& str) const {
			switch (m_wildcard) {
			case NoWildcard:
				return m_pattern == adjustCase(str);
			case WildcardAtStart:
				return endsWith(adjustCase(str), m_pattern);
			case WildcardAtEnd:
				return startsWith(adjustCase(str), m_pattern);
			case WildcardAtBothEnds:
				return contains(adjustCase(str), m_pattern);
			}

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wunreachable-code"
#endif
			throw std::logic_error("Unknown enum");
#ifdef __clang__
#pragma clang diagnostic pop
#endif
		}